

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall
GlobOpt::MergeBoundCheckHoistBlockData
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,BasicBlock *fromBlock,
          GlobOptBlockData *fromData)

{
  int *this_00;
  ValueNumber VVar1;
  ValueNumber VVar2;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar3;
  GlobOptBlockData *pGVar4;
  bool bVar5;
  undefined4 *puVar6;
  IntBoundCheck *this_02;
  Instr *pIVar7;
  Instr *pIVar8;
  EntryType *pEVar9;
  InductionVariable *pIVar10;
  StackSym *pSVar11;
  Value *pVVar12;
  Value *pVVar13;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar14;
  IntBoundCheckSet *dictionary;
  Loop *loop;
  Loop *pLVar15;
  GlobOptBlockData *pGVar16;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar17;
  GlobOpt *this_03;
  undefined1 local_c8 [8];
  BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  it;
  IntBoundCheck *fromDataIntBoundCheck;
  SymID local_54;
  GlobOptBlockData *pGStack_50;
  int i;
  GlobOptBlockData *local_48;
  GlobOpt *local_40;
  IntBoundCheckCompatibilityId local_38;
  InductionVariable *mergedInductionVariable;
  
  local_40 = this;
  bVar5 = DoBoundCheckHoist(this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3be,"(DoBoundCheckHoist())","DoBoundCheckHoist()");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (toBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3bf,"(toBlock)","toBlock");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (toData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3c0,"(toData)","toData");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (fromBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3c2,"(fromBlock)","fromBlock");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (fromData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3c3,"(fromData)","fromData");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (&fromBlock->globOptData != fromData) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3c4,"(fromData == &fromBlock->globOptData)",
                       "fromData == &fromBlock->globOptData");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  dictionary = toData->availableIntBoundChecks;
  if (dictionary == (IntBoundCheckSet *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x3c5,"(toData->availableIntBoundChecks)","toData->availableIntBoundChecks")
    ;
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
    dictionary = toData->availableIntBoundChecks;
  }
  pGStack_50 = toData;
  JsUtil::
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::
  BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::BucketEntryIterator
            ((BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              *)local_c8,dictionary);
  bVar5 = JsUtil::
          BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_c8);
  local_48 = fromData;
  if (bVar5) {
    do {
      pGVar16 = local_48;
      this_02 = (IntBoundCheck *)
                JsUtil::
                BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_c8);
      this_01 = &pGVar16->availableIntBoundChecks->
                 super_BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ;
      local_38 = IntBoundCheck::CompatibilityId(this_02);
      bVar5 = JsUtil::
              BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<IntBoundCheckCompatibilityId>
                        (this_01,&local_38,(IntBoundCheck **)&it.previousEntryIndexInBucket,
                         (int *)&local_54);
      if (bVar5) {
        pIVar7 = IntBoundCheck::Instr((IntBoundCheck *)it._56_8_);
        pIVar8 = IntBoundCheck::Instr(this_02);
        if (pIVar7 != pIVar8) goto LAB_004a3e2c;
      }
      else {
LAB_004a3e2c:
        JsUtil::
        BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::RemoveCurrent((BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
      }
      JsUtil::
      BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)local_c8);
      bVar5 = JsUtil::
              BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((BucketEntryIterator<JsUtil::BaseHashSet<IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_IntBoundCheckCompatibilityId,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
    } while (bVar5);
  }
  pGVar4 = local_48;
  pGVar16 = pGStack_50;
  if ((toBlock->field_0x18 & 4) == 0) {
    pLVar15 = toBlock->loop;
    if (pLVar15 == (Loop *)0x0) {
      return;
    }
    if (local_40->prePassLoop == (Loop *)0x0) {
      return;
    }
    loop = fromBlock->loop;
    if (loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x42c,"(fromBlock->loop)","fromBlock->loop");
      if (!bVar5) goto LAB_004a46d9;
      *puVar6 = 0;
      pLVar15 = toBlock->loop;
      loop = fromBlock->loop;
    }
    bVar5 = Loop::IsDescendentOrSelf(pLVar15,loop);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x42d,"(toBlock->loop->IsDescendentOrSelf(fromBlock->loop))",
                         "toBlock->loop->IsDescendentOrSelf(fromBlock->loop)");
      if (!bVar5) goto LAB_004a46d9;
      *puVar6 = 0;
    }
    this_03 = (GlobOpt *)pGVar16->inductionVariables;
  }
  else {
    if (fromBlock->loop != toBlock->loop) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x3d7,"(fromBlock->loop == toBlock->loop)",
                         "fromBlock->loop == toBlock->loop");
      if (!bVar5) goto LAB_004a46d9;
      *puVar6 = 0;
    }
    pGVar16 = pGStack_50;
    if (local_40->prePassLoop != (Loop *)0x0) {
      if (local_40->prePassLoop == toBlock->loop) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x3df,"(prePassLoop != toBlock->loop)","prePassLoop != toBlock->loop");
        if (!bVar5) goto LAB_004a46d9;
        *puVar6 = 0;
      }
      if (pGVar4->inductionVariables == (InductionVariableSet *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x3e0,"(fromData->inductionVariables)","fromData->inductionVariables");
        if (!bVar5) goto LAB_004a46d9;
        *puVar6 = 0;
      }
      pBVar17 = &pGVar16->inductionVariables->
                 super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ;
      if (pBVar17 ==
          (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x3e1,"(toData->inductionVariables)","toData->inductionVariables");
        if (!bVar5) goto LAB_004a46d9;
        *puVar6 = 0;
        pBVar17 = &pGVar16->inductionVariables->
                   super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_c8,pGVar4->inductionVariables);
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
      if (bVar5) {
        pGStack_50 = (GlobOptBlockData *)__tls_get_addr(&PTR_01548f08);
        this_00 = &it.previousEntryIndexInBucket;
        do {
          pEVar9 = JsUtil::
                   BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::
                   IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                   ::Current((IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                              *)local_c8);
          it._56_8_ = (pEVar9->
                      super_DefaultHashedEntry<unsigned_int,_InductionVariable,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      ).super_ImplicitKeyValueEntry<unsigned_int,_InductionVariable>.
                      super_ValueEntry<InductionVariable,_JsUtil::(anonymous_namespace)::ValueEntryData<InductionVariable>_>
                      .super_ValueEntryData<InductionVariable>.value.sym;
          InductionVariable::ExpandInnerLoopChange((InductionVariable *)this_00);
          pSVar11 = InductionVariable::Sym((InductionVariable *)this_00);
          bVar5 = JsUtil::
                  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::TryGetReference<unsigned_int>
                            (pBVar17,&(pSVar11->super_Sym).m_id,(InductionVariable **)&local_38,
                             (int *)&local_54);
          if (bVar5) {
            InductionVariable::Merge((InductionVariable *)local_38,(InductionVariable *)this_00);
          }
          else {
            pVVar12 = GlobOptBlockData::FindValue
                                (&local_40->currentBlock->loop->parent->landingPad->globOptData,
                                 &pSVar11->super_Sym);
            if (pVVar12 != (Value *)0x0) {
              pVVar13 = GlobOptBlockData::FindValue
                                  (&local_40->currentBlock->loop->landingPad->globOptData,
                                   &pSVar11->super_Sym);
              if (pVVar13 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                pGVar16 = pGStack_50;
                *(undefined4 *)&pGStack_50->symToValueMap = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                                   ,0x3f8,"(landingPadValue)","landingPadValue");
                if (!bVar5) goto LAB_004a46d9;
                *(undefined4 *)&pGVar16->symToValueMap = 0;
              }
              if (pVVar13->valueNumber == pVVar12->valueNumber) {
                pSVar11 = InductionVariable::Sym((InductionVariable *)this_00);
                local_54 = (pSVar11->super_Sym).m_id;
                JsUtil::
                BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                          ((BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                            *)pBVar17,&local_54,(InductionVariable *)this_00);
              }
            }
          }
          JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::MoveNext((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                      *)local_c8);
          bVar5 = JsUtil::
                  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::
                  EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                             *)local_c8);
        } while (bVar5);
      }
      pBVar14 = &local_48->inductionVariables->
                 super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ;
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_c8,
                      (BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)pBVar17);
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
      if (!bVar5) {
        return;
      }
      do {
        pIVar10 = (InductionVariable *)
                  JsUtil::
                  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::
                  IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                  ::Current((IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                             *)local_c8);
        bVar5 = InductionVariable::IsChangeDeterminate(pIVar10);
        if (bVar5) {
          pSVar11 = InductionVariable::Sym(pIVar10);
          bVar5 = JsUtil::
                  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::TryGetReference<unsigned_int>
                            (pBVar14,&(pSVar11->super_Sym).m_id,
                             (InductionVariable **)&it.previousEntryIndexInBucket,(int *)&local_38);
          if ((((!bVar5) &&
               (pVVar12 = GlobOptBlockData::FindValue(local_48,&pSVar11->super_Sym),
               pVVar12 != (Value *)0x0)) &&
              (pVVar13 = GlobOptBlockData::FindValue
                                   (&toBlock->loop->landingPad->globOptData,&pSVar11->super_Sym),
              pVVar13 != (Value *)0x0)) && (pVVar12->valueNumber != pVVar13->valueNumber)) {
            InductionVariable::SetChangeIsIndeterminate(pIVar10);
          }
        }
        JsUtil::
        BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    *)local_c8);
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_c8);
      } while (bVar5);
      return;
    }
    if (pGVar4->inductionVariables == (InductionVariableSet *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x421,"(fromData->inductionVariables)","fromData->inductionVariables");
      if (!bVar5) goto LAB_004a46d9;
      *puVar6 = 0;
    }
    pLVar15 = toBlock->loop;
    this_03 = (GlobOpt *)pLVar15->inductionVariables;
    if (this_03 == (GlobOpt *)0x0) {
      pBVar17 = &local_48->inductionVariables->
                 super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ;
      pBVar14 = (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::JitArenaAllocator>(0x38,pBVar17->alloc,0x3eba5c);
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(pBVar14,pBVar17);
      pLVar15->inductionVariables = (InductionVariableSet *)pBVar14;
      return;
    }
  }
  pBVar17 = &local_48->inductionVariables->
             super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  if (pBVar17 ==
      (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x438,"(fromDataInductionVariables)","fromDataInductionVariables");
    if (!bVar5) goto LAB_004a46d9;
    *puVar6 = 0;
  }
  if (this_03 == (GlobOpt *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x439,"(mergedInductionVariables)","mergedInductionVariables");
    if (!bVar5) {
LAB_004a46d9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   *)local_c8,
                  (BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)this_03);
  bVar5 = JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_c8);
  local_40 = this_03;
  if (bVar5) {
    do {
      pIVar10 = (InductionVariable *)
                JsUtil::
                BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_c8);
      bVar5 = InductionVariable::IsChangeDeterminate(pIVar10);
      if (bVar5) {
        pSVar11 = InductionVariable::Sym(pIVar10);
        bVar5 = JsUtil::
                BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::TryGetReference<unsigned_int>
                          (pBVar17,&(pSVar11->super_Sym).m_id,(InductionVariable **)&local_38,
                           &it.previousEntryIndexInBucket);
        if (bVar5) {
          InductionVariable::Merge(pIVar10,(InductionVariable *)local_38);
          this_03 = local_40;
        }
        else {
          pVVar12 = GlobOptBlockData::FindValue(local_48,&pSVar11->super_Sym);
          if (((pVVar12 == (Value *)0x0) ||
              (pVVar13 = GlobOptBlockData::FindValue
                                   (&toBlock->loop->landingPad->globOptData,&pSVar11->super_Sym),
              pVVar13 == (Value *)0x0)) || (pVVar12->valueNumber != pVVar13->valueNumber)) {
            InductionVariable::SetChangeIsIndeterminate(pIVar10);
            this_03 = local_40;
          }
          else {
            InductionVariable::InductionVariable
                      ((InductionVariable *)&it.previousEntryIndexInBucket,pSVar11,1,0);
            InductionVariable::Merge(pIVar10,(InductionVariable *)&it.previousEntryIndexInBucket);
            this_03 = local_40;
          }
        }
      }
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)local_c8);
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
    } while (bVar5);
  }
  JsUtil::
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   *)local_c8,
                  (BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)pBVar17);
  bVar5 = JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_c8);
  if (bVar5) {
    local_48 = (GlobOptBlockData *)CONCAT44(local_48._4_4_,1);
    pGVar16 = pGStack_50;
    do {
      pIVar10 = (InductionVariable *)
                JsUtil::
                BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_c8);
      pSVar11 = InductionVariable::Sym(pIVar10);
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey((BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)this_03,&(pSVar11->super_Sym).m_id);
      if (!bVar5) {
        pVVar12 = GlobOptBlockData::FindValue(pGVar16,&pSVar11->super_Sym);
        if ((pVVar12 == (Value *)0x0) ||
           (pVVar13 = GlobOptBlockData::FindValue
                                (&toBlock->loop->landingPad->globOptData,&pSVar11->super_Sym),
           pVVar13 == (Value *)0x0)) {
          InductionVariable::InductionVariable
                    ((InductionVariable *)&it.previousEntryIndexInBucket,pSVar11,
                     (ValueNumber)local_48,0);
LAB_004a4649:
          InductionVariable::SetChangeIsIndeterminate
                    ((InductionVariable *)&it.previousEntryIndexInBucket);
        }
        else {
          VVar1 = pVVar12->valueNumber;
          VVar2 = pVVar13->valueNumber;
          InductionVariable::InductionVariable
                    ((InductionVariable *)&it.previousEntryIndexInBucket,pSVar11,
                     (ValueNumber)local_48,0);
          this_03 = local_40;
          if (VVar1 != VVar2) goto LAB_004a4649;
          InductionVariable::Merge((InductionVariable *)&it.previousEntryIndexInBucket,pIVar10);
        }
        pGVar16 = pGStack_50;
        pSVar11 = InductionVariable::Sym((InductionVariable *)&it.previousEntryIndexInBucket);
        local_38.leftValueNumber = (pSVar11->super_Sym).m_id;
        JsUtil::
        BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                    *)this_03,&local_38.leftValueNumber,
                   (InductionVariable *)&it.previousEntryIndexInBucket);
      }
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)local_c8);
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<const_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_c8);
    } while (bVar5);
  }
  return;
}

Assistant:

void GlobOpt::MergeBoundCheckHoistBlockData(
    BasicBlock *const toBlock,
    GlobOptBlockData *const toData,
    BasicBlock *const fromBlock,
    GlobOptBlockData *const fromData)
{
    Assert(DoBoundCheckHoist());
    Assert(toBlock);
    Assert(toData);
    //Assert(toData == &toBlock->globOptData || toData == &currentBlock->globOptData);
    Assert(fromBlock);
    Assert(fromData);
    Assert(fromData == &fromBlock->globOptData);
    Assert(toData->availableIntBoundChecks);

    for(auto it = toData->availableIntBoundChecks->GetIteratorWithRemovalSupport(); it.IsValid(); it.MoveNext())
    {
        const IntBoundCheck &toDataIntBoundCheck = it.CurrentValue();
        const IntBoundCheck *fromDataIntBoundCheck;
        if(!fromData->availableIntBoundChecks->TryGetReference(
                toDataIntBoundCheck.CompatibilityId(),
                &fromDataIntBoundCheck) ||
            fromDataIntBoundCheck->Instr() != toDataIntBoundCheck.Instr())
        {
            it.RemoveCurrent();
        }
    }

    InductionVariableSet *mergeInductionVariablesInto;
    if(toBlock->isLoopHeader)
    {
        Assert(fromBlock->loop == toBlock->loop); // The flow is such that you cannot have back-edges from an inner loop

        if(IsLoopPrePass())
        {
            // Collect info for the parent loop. Any changes to induction variables in this inner loop need to be expanded in
            // the same direction for the parent loop, so merge expanded info from back-edges. Info about induction variables
            // that changed before the loop but not inside the loop, can be kept intact because the landing pad dominates the
            // loop.
            Assert(prePassLoop != toBlock->loop);
            Assert(fromData->inductionVariables);
            Assert(toData->inductionVariables);

            InductionVariableSet *const mergedInductionVariables = toData->inductionVariables;
            for(auto it = fromData->inductionVariables->GetIterator(); it.IsValid(); it.MoveNext())
            {
                InductionVariable backEdgeInductionVariable = it.CurrentValue();
                backEdgeInductionVariable.ExpandInnerLoopChange();
                StackSym *const sym = backEdgeInductionVariable.Sym();
                InductionVariable *mergedInductionVariable;
                if(mergedInductionVariables->TryGetReference(sym->m_id, &mergedInductionVariable))
                {
                    mergedInductionVariable->Merge(backEdgeInductionVariable);
                    continue;
                }

                // Ensure that the sym is live in the parent loop's landing pad, and that its value has not changed in an
                // unknown way between the parent loop's landing pad and the current loop's landing pad.
                Value *const parentLandingPadValue = currentBlock->loop->parent->landingPad->globOptData.FindValue(sym);
                if(!parentLandingPadValue)
                {
                    continue;
                }
                Value *const landingPadValue = currentBlock->loop->landingPad->globOptData.FindValue(sym);
                Assert(landingPadValue);
                if(landingPadValue->GetValueNumber() == parentLandingPadValue->GetValueNumber())
                {
                    mergedInductionVariables->Add(backEdgeInductionVariable);
                }
            }

            const InductionVariableSet *const fromDataInductionVariables = fromData->inductionVariables;
            for (auto it = mergedInductionVariables->GetIterator(); it.IsValid(); it.MoveNext())
            {
                InductionVariable &mergedInductionVariable = it.CurrentValueReference();
                if (!mergedInductionVariable.IsChangeDeterminate())
                {
                    continue;
                }

                StackSym *const sym = mergedInductionVariable.Sym();
                const InductionVariable *fromDataInductionVariable;
                if (fromDataInductionVariables->TryGetReference(sym->m_id, &fromDataInductionVariable))
                {
                    continue;
                }

                // Process the set of symbols that are induction variables due to prior loops that share the same parent loop, but are not induction variables in the current loop
                // If the current loop is initializing such carried over induction variables, then their value numbers will differ from the current loop's landing pad
                // Such induction variables should be marked as indeterminate going forward, such the  induction variable analysis accurately flows to the parent loop.
                Value *const fromDataValue = fromData->FindValue(sym);
                if (fromDataValue)
                {
                    Value *const landingPadValue = toBlock->loop->landingPad->globOptData.FindValue(sym);
                    if (landingPadValue && fromDataValue->GetValueNumber() != landingPadValue->GetValueNumber())
                    {
                        mergedInductionVariable.SetChangeIsIndeterminate();
                    }
                }
            }
            return;
        }

        // Collect info for the current loop. We want to merge only the back-edge info without the landing pad info, such that
        // the loop's induction variable set reflects changes made inside this loop.
        Assert(fromData->inductionVariables);
        InductionVariableSet *&loopInductionVariables = toBlock->loop->inductionVariables;
        if(!loopInductionVariables)
        {
            loopInductionVariables = fromData->inductionVariables->Clone();
            return;
        }
        mergeInductionVariablesInto = loopInductionVariables;
    }
    else if(toBlock->loop && IsLoopPrePass())
    {
        Assert(fromBlock->loop);
        Assert(toBlock->loop->IsDescendentOrSelf(fromBlock->loop));
        mergeInductionVariablesInto = toData->inductionVariables;
    }
    else
    {
        return;
    }

    const InductionVariableSet *const fromDataInductionVariables = fromData->inductionVariables;
    InductionVariableSet *const mergedInductionVariables = mergeInductionVariablesInto;

    Assert(fromDataInductionVariables);
    Assert(mergedInductionVariables);

    for(auto it = mergedInductionVariables->GetIterator(); it.IsValid(); it.MoveNext())
    {
        InductionVariable &mergedInductionVariable = it.CurrentValueReference();
        if(!mergedInductionVariable.IsChangeDeterminate())
        {
            continue;
        }

        StackSym *const sym = mergedInductionVariable.Sym();
        const InductionVariable *fromDataInductionVariable;
        if(fromDataInductionVariables->TryGetReference(sym->m_id, &fromDataInductionVariable))
        {
            mergedInductionVariable.Merge(*fromDataInductionVariable);
            continue;
        }

        // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet on the path
        // where the sym is not already marked as an induction variable.
        Value *const fromDataValue = fromData->FindValue(sym);
        if(fromDataValue)
        {
            Value *const landingPadValue = toBlock->loop->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && fromDataValue->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                mergedInductionVariable.Merge(InductionVariable(sym, ZeroValueNumber, 0));
                continue;
            }
        }
        mergedInductionVariable.SetChangeIsIndeterminate();
    }

    for(auto it = fromDataInductionVariables->GetIterator(); it.IsValid(); it.MoveNext())
    {
        const InductionVariable &fromDataInductionVariable = it.CurrentValue();
        StackSym *const sym = fromDataInductionVariable.Sym();
        if(mergedInductionVariables->ContainsKey(sym->m_id))
        {
            continue;
        }

        // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet on the path
        // where the sym is not already marked as an induction variable.
        bool indeterminate = true;
        Value *const toDataValue = toData->FindValue(sym);
        if(toDataValue)
        {
            Value *const landingPadValue = toBlock->loop->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && toDataValue->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                indeterminate = false;
            }
        }
        InductionVariable mergedInductionVariable(sym, ZeroValueNumber, 0);
        if(indeterminate)
        {
            mergedInductionVariable.SetChangeIsIndeterminate();
        }
        else
        {
            mergedInductionVariable.Merge(fromDataInductionVariable);
        }
        mergedInductionVariables->Add(mergedInductionVariable);
    }
}